

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedExe.cpp
# Opt level: O0

QString * __thiscall
ExeWrappersContainer::getWrapperName
          (QString *__return_storage_ptr__,ExeWrappersContainer *this,size_t id)

{
  bool bVar1;
  mapped_type *ppEVar2;
  _Self local_30;
  _Self local_28;
  size_t local_20;
  size_t id_local;
  ExeWrappersContainer *this_local;
  
  local_20 = id;
  id_local = (size_t)this;
  this_local = (ExeWrappersContainer *)__return_storage_ptr__;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
       ::find(&this->wrappers,&local_20);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
       ::end(&this->wrappers);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    QString::QString(__return_storage_ptr__,"");
  }
  else {
    ppEVar2 = std::
              map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
              ::operator[](&this->wrappers,&local_20);
    (*((*ppEVar2)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QString ExeWrappersContainer::getWrapperName(size_t id)
{
    if (wrappers.find(id) == wrappers.end()) return "";
    return wrappers[id]->getName();
}